

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
binary_writer<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
::write_number<unsigned_short,false>
          (binary_writer<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
           *this,unsigned_short n)

{
  unsigned_short *puVar1;
  iterator __first;
  iterator __last;
  element_type *peVar2;
  pointer pvVar3;
  array<unsigned_char,_2UL> local_14;
  unsigned_short local_12;
  array<unsigned_char,_2UL> vec;
  binary_writer<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
  *pbStack_10;
  unsigned_short n_local;
  binary_writer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char>
  *this_local;
  
  local_12 = n;
  pbStack_10 = this;
  memset(&local_14,0,2);
  puVar1 = (unsigned_short *)std::array<unsigned_char,_2UL>::data(&local_14);
  *puVar1 = local_12;
  if (((byte)*this & 1) != 0) {
    __first = std::array<unsigned_char,_2UL>::begin(&local_14);
    __last = std::array<unsigned_char,_2UL>::end(&local_14);
    std::reverse<unsigned_char*>(__first,__last);
  }
  peVar2 = std::
           __shared_ptr_access<nlohmann::detail::output_adapter_protocol<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(this + 8));
  pvVar3 = std::array<unsigned_char,_2UL>::data(&local_14);
  (*peVar2->_vptr_output_adapter_protocol[1])(peVar2,pvVar3,2);
  return;
}

Assistant:

void write_number(const NumberType n)
    {
        // step 1: write number to array of length NumberType
        std::array<CharType, sizeof(NumberType)> vec{};
        std::memcpy(vec.data(), &n, sizeof(NumberType));

        // step 2: write array to output (with possible reordering)
        if (is_little_endian != OutputIsLittleEndian)
        {
            // reverse byte order prior to conversion if necessary
            std::reverse(vec.begin(), vec.end());
        }

        oa->write_characters(vec.data(), sizeof(NumberType));
    }